

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_enc_Utf8Dfa.h
# Opt level: O3

void __thiscall
axl::enc::Utf8Dfa::
emitPendingCus<axl::enc::Convert<axl::enc::Utf8,axl::enc::Utf8,axl::sl::Nop<wchar_t,wchar_t>,axl::enc::Utf8Decoder>::CountingEmitter>
          (Utf8Dfa *this,CountingEmitter *emitter,utf8_t *p)

{
  uint_t uVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  size_t sVar5;
  uint uVar6;
  
  uVar1 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_state;
  switch(uVar1 << 0x1d | uVar1 - 0x10 >> 3) {
  case 0:
  case 1:
    uVar3 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp | 0xc0;
    uVar6 = emitter->m_replacement;
    do {
      if (uVar3 < 0x80) goto LAB_00145df1;
      if (uVar3 < 0x10000) goto LAB_00145de1;
      bVar2 = 0x1fffff < uVar3;
      uVar3 = uVar6;
      uVar6 = 0xfffd;
    } while (bVar2);
    break;
  case 2:
  case 3:
    uVar3 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp | 0xe0;
    uVar6 = emitter->m_replacement;
    do {
      if (uVar3 < 0x80) goto LAB_00145df1;
      if (uVar3 < 0x10000) goto LAB_00145de1;
      bVar2 = 0x1fffff < uVar3;
      uVar3 = uVar6;
      uVar6 = 0xfffd;
    } while (bVar2);
    break;
  case 4:
    uVar3 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp >> 6 | 0xe0;
    uVar6 = emitter->m_replacement;
    do {
      if (uVar3 < 0x80) goto LAB_00145ea0;
      if (uVar3 < 0x10000) goto LAB_00145e90;
      bVar2 = 0x1fffff < uVar3;
      uVar3 = uVar6;
      uVar6 = 0xfffd;
    } while (bVar2);
    goto LAB_00145e58;
  default:
    goto switchD_00145d5f_caseD_5;
  case 6:
  case 7:
    uVar3 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp | 0xf0;
    uVar6 = emitter->m_replacement;
    do {
      if (uVar3 < 0x80) goto LAB_00145df1;
      if (uVar3 < 0x10000) goto LAB_00145de1;
      bVar2 = 0x1fffff < uVar3;
      uVar3 = uVar6;
      uVar6 = 0xfffd;
    } while (bVar2);
    break;
  case 8:
    uVar3 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp >> 6 | 0xf0;
    uVar6 = emitter->m_replacement;
    do {
      if (uVar3 < 0x80) goto LAB_00145ea0;
      if (uVar3 < 0x10000) goto LAB_00145e90;
      bVar2 = 0x1fffff < uVar3;
      uVar3 = uVar6;
      uVar6 = 0xfffd;
    } while (bVar2);
LAB_00145e58:
    lVar4 = 4;
    goto LAB_00145ea5;
  case 10:
    uVar3 = (this->super_UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap>).m_cp >> 0xc | 0xf0;
    uVar6 = emitter->m_replacement;
    do {
      if (uVar3 < 0x80) {
        lVar4 = 1;
        goto LAB_00145ec6;
      }
      if (uVar3 < 0x10000) {
        lVar4 = 3 - (ulong)(uVar3 < 0x800);
        goto LAB_00145ec6;
      }
      bVar2 = 0x1fffff < uVar3;
      uVar3 = uVar6;
      uVar6 = 0xfffd;
    } while (bVar2);
    lVar4 = 4;
LAB_00145ec6:
    sVar5 = lVar4 + emitter->m_length + 4;
    goto LAB_00145ed0;
  }
  lVar4 = 4;
  goto LAB_00145df6;
LAB_00145ea0:
  lVar4 = 1;
  goto LAB_00145ea5;
LAB_00145e90:
  lVar4 = 3 - (ulong)(uVar3 < 0x800);
LAB_00145ea5:
  sVar5 = lVar4 + emitter->m_length + 2;
  goto LAB_00145ed0;
LAB_00145df1:
  lVar4 = 1;
  goto LAB_00145df6;
LAB_00145de1:
  lVar4 = 3 - (ulong)(uVar3 < 0x800);
LAB_00145df6:
  sVar5 = lVar4 + emitter->m_length;
LAB_00145ed0:
  emitter->m_length = sVar5;
switchD_00145d5f_caseD_5:
  return;
}

Assistant:

void
	emitPendingCus(
		Emitter& emitter,
		const utf8_t* p
	) {
		switch (m_state) {
		case State_1_2:
		case State_1_2_Error:
			emitter.emitCu(p, 0xc0 | m_cp);
			break;

		case State_1_3:
		case State_1_3_Error:
			emitter.emitCu(p, 0xe0 | m_cp);
			break;

		case State_2_3:
			emitter.emitCu(p - 1, 0xe0 | (m_cp >> 6));
			emitter.emitCu(p, 0x80 | (m_cp & 0x3f));
			break;

		case State_1_4:
		case State_1_4_Error:
			emitter.emitCu(p, 0xf0 | m_cp);
			break;

		case State_2_4:
			emitter.emitCu(p - 1, 0xf0 | (m_cp >> 6));
			emitter.emitCu(p, 0x80 | (m_cp & 0x3f));
			break;

		case State_3_4:
			emitter.emitCu(p - 2, 0xf0 | (m_cp >> 12));
			emitter.emitCu(p - 1, 0x80 | ((m_cp >> 6) & 0x3f));
			emitter.emitCu(p, 0x80 | (m_cp & 0x3f));
			break;
		}
	}